

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  BYTE *pBVar4;
  ulong *iEnd;
  int *iStart;
  long *plVar5;
  BYTE *pBVar6;
  ulong *puVar7;
  undefined8 *puVar8;
  uint uVar9;
  BYTE *pBVar10;
  ZSTD_matchState_t *pZVar11;
  BYTE *pBVar12;
  ulong *mEnd;
  U32 *pUVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  U32 *pUVar16;
  seqDef *psVar17;
  bool bVar18;
  uint uVar19;
  undefined8 uVar20;
  char cVar21;
  char cVar22;
  uint uVar23;
  ulong *puVar24;
  size_t sVar25;
  int *piVar26;
  byte bVar27;
  byte bVar29;
  byte bVar30;
  U32 UVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  int *piVar35;
  long lVar36;
  uint uVar37;
  BYTE *unaff_RBP;
  BYTE *litEnd_3;
  BYTE *pBVar38;
  int *piVar39;
  ulong *puVar40;
  ulong *puVar41;
  uint uVar42;
  ulong uVar43;
  ulong *puVar44;
  uint uVar45;
  uint uVar46;
  ulong uVar48;
  int iVar49;
  int iVar50;
  ulong uVar51;
  int iVar52;
  size_t _size;
  ulong *puVar53;
  U32 UVar54;
  ulong *puVar55;
  char *_ptr;
  ulong uVar56;
  U32 *pUVar57;
  uint uVar58;
  BYTE *litEnd;
  U32 UVar59;
  BYTE *litLimit_w;
  BYTE *base;
  BYTE *ilimit;
  U32 prefixLowestIndex;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 dictIndexDelta;
  BYTE *dictBase;
  BYTE *dictEnd;
  BYTE *litLimit_w_3;
  BYTE *pInLoopLimit;
  BYTE *dictStart;
  U32 *hashLong;
  U32 dictStartIndex;
  U32 *hashSmall;
  U32 local_154;
  BYTE *local_130;
  ulong *local_118;
  BYTE *local_f8;
  byte bVar28;
  ulong uVar47;
  
  pBVar10 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar49 = (int)pBVar10;
  iVar52 = (int)iEnd - iVar49;
  uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar9 = (ms->window).dictLimit;
  uVar19 = iVar52 - uVar23;
  if (iVar52 - uVar9 <= uVar23) {
    uVar19 = uVar9;
  }
  if (ms->loadedDictEnd != 0) {
    uVar19 = uVar9;
  }
  iStart = (int *)(pBVar10 + uVar19);
  puVar7 = (ulong *)((long)src + (srcSize - 8));
  pZVar11 = ms->dictMatchState;
  uVar9 = (pZVar11->window).dictLimit;
  pBVar12 = (pZVar11->window).base;
  piVar39 = (int *)(pBVar12 + uVar9);
  mEnd = (ulong *)(pZVar11->window).nextSrc;
  uVar45 = ((int)pBVar12 - (int)mEnd) + uVar19;
  uVar47 = (ulong)uVar45;
  pUVar13 = pZVar11->hashTable;
  pUVar14 = pZVar11->chainTable;
  uVar23 = (pZVar11->cParams).hashLog;
  uVar58 = (pZVar11->cParams).chainLog;
  iVar50 = ((int)src - ((int)iStart + (int)piVar39)) + (int)mEnd;
  uVar42 = (ms->cParams).minMatch;
  pUVar15 = ms->hashTable;
  pUVar16 = ms->chainTable;
  iVar52 = ms->prefetchCDictTables;
  local_154 = *rep;
  UVar59 = rep[1];
  bVar27 = (byte)uVar23;
  bVar28 = (byte)uVar58;
  cVar21 = (char)(ms->cParams).hashLog;
  cVar22 = (char)(ms->cParams).chainLog;
  local_118 = (ulong *)src;
  if (uVar42 == 5) {
    if (iVar52 != 0) {
      if (uVar23 < 0x3e) {
        uVar34 = 0;
        do {
          uVar34 = uVar34 + 0x40;
        } while (uVar34 < (ulong)(4L << (bVar27 & 0x3f)));
      }
      if (uVar58 < 0x3e) {
        uVar34 = 0;
        do {
          uVar34 = uVar34 + 0x40;
        } while (uVar34 < (ulong)(4L << (bVar28 & 0x3f)));
      }
    }
    puVar53 = (ulong *)((long)src + (ulong)(iVar50 == 0));
    if (puVar53 < puVar7) {
      bVar29 = 0x40 - cVar21;
      bVar30 = 0x40 - cVar22;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar3 = (ulong *)((long)iEnd + -1);
      puVar24 = iEnd + -4;
      pBVar4 = pBVar10 + -1;
      local_130 = pBVar4;
      do {
        uVar34 = *puVar53;
        uVar48 = uVar34 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
        uVar51 = uVar34 * -0x30e4432345000000 >> (bVar30 & 0x3f);
        uVar43 = uVar34 * -0x30e44323485a9b9d >> (0x38 - bVar27 & 0x3f);
        uVar56 = uVar34 * -0x30e4432345000000 >> (0x38 - bVar28 & 0x3f);
        uVar23 = pUVar13[uVar43 >> 8];
        uVar58 = pUVar14[uVar56 >> 8];
        UVar54 = (int)puVar53 - iVar49;
        uVar42 = pUVar15[uVar48];
        UVar31 = UVar54 + 1;
        uVar32 = UVar31 - local_154;
        piVar35 = (int *)(pBVar10 + uVar32);
        if (uVar32 < uVar19) {
          piVar35 = (int *)(pBVar12 + (uVar32 - uVar45));
        }
        uVar33 = pUVar16[uVar51];
        pUVar16[uVar51] = UVar54;
        pUVar15[uVar48] = UVar54;
        if (((uVar19 - 1) - uVar32 < 3) || (*piVar35 != *(int *)((long)puVar53 + 1))) {
          if (uVar19 < uVar42) {
            puVar55 = (ulong *)(pBVar10 + uVar42);
            if (*puVar55 == uVar34) {
              puVar41 = puVar53 + 1;
              puVar44 = puVar55 + 1;
              puVar40 = puVar41;
              if (puVar41 < puVar1) {
                uVar43 = *puVar41 ^ *puVar44;
                uVar34 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                if (*puVar44 == *puVar41) {
                  puVar40 = puVar53 + 2;
                  puVar44 = puVar55 + 2;
                  do {
                    if (puVar1 <= puVar40) goto LAB_01933a2b;
                    uVar34 = *puVar44;
                    uVar43 = *puVar40;
                    uVar51 = uVar43 ^ uVar34;
                    uVar48 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)((long)puVar40 + ((uVar48 >> 3 & 0x1fffffff) - (long)puVar41))
                    ;
                    puVar40 = puVar40 + 1;
                    puVar44 = puVar44 + 1;
                  } while (uVar34 == uVar43);
                }
              }
              else {
LAB_01933a2b:
                if ((puVar40 < puVar2) && ((int)*puVar44 == (int)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar40 < puVar3) && ((short)*puVar44 == (short)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar40 < iEnd) {
                  puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar40));
                }
                pBVar38 = (BYTE *)((long)puVar40 - (long)puVar41);
              }
              unaff_RBP = pBVar38 + 8;
              local_130 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)puVar55);
              puVar55 = puVar53;
              if (local_118 < puVar53) {
                piVar35 = (int *)(pBVar4 + uVar42);
                puVar55 = (ulong *)((long)puVar53 + -1);
                do {
                  if ((BYTE)*puVar55 != (BYTE)*piVar35) {
                    puVar55 = (ulong *)((long)puVar55 + 1);
                    goto LAB_01933f52;
                  }
                  unaff_RBP = unaff_RBP + 1;
                  puVar53 = (ulong *)((long)puVar55 + -1);
                } while ((local_118 < puVar55) &&
                        (bVar18 = iStart < piVar35, piVar35 = (int *)((long)piVar35 + -1),
                        puVar55 = puVar53, bVar18));
                goto LAB_01933ac8;
              }
              goto LAB_01933f52;
            }
LAB_01933742:
            if (uVar19 < uVar33) {
              piVar35 = (int *)(pBVar10 + uVar33);
              if (*piVar35 == (int)*puVar53) {
LAB_0193375b:
                lVar36 = *(long *)((long)puVar53 + 1);
                uVar43 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f);
                uVar34 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x38 - bVar27 & 0x3f);
                puVar55 = (ulong *)((long)puVar53 + 1);
                uVar23 = pUVar15[uVar43];
                uVar58 = pUVar13[uVar34 >> 8];
                pUVar15[uVar43] = UVar31;
                if (uVar19 < uVar23) {
                  plVar5 = (long *)(pBVar10 + uVar23);
                  if (*plVar5 == lVar36) {
                    puVar41 = (ulong *)((long)puVar53 + 9);
                    puVar44 = (ulong *)(plVar5 + 1);
                    puVar40 = puVar41;
                    if (puVar41 < puVar1) {
                      uVar43 = *puVar41 ^ *puVar44;
                      uVar34 = 0;
                      if (uVar43 != 0) {
                        for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                      if (*puVar44 == *puVar41) {
                        puVar40 = (ulong *)((long)puVar53 + 0x11);
                        puVar44 = (ulong *)(plVar5 + 2);
                        do {
                          if (puVar1 <= puVar40) goto LAB_01933c36;
                          uVar34 = *puVar44;
                          uVar43 = *puVar40;
                          uVar51 = uVar43 ^ uVar34;
                          uVar48 = 0;
                          if (uVar51 != 0) {
                            for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                            }
                          }
                          pBVar38 = (BYTE *)((long)puVar40 +
                                            ((uVar48 >> 3 & 0x1fffffff) - (long)puVar41));
                          puVar40 = puVar40 + 1;
                          puVar44 = puVar44 + 1;
                        } while (uVar34 == uVar43);
                      }
                    }
                    else {
LAB_01933c36:
                      if ((puVar40 < puVar2) && ((int)*puVar44 == (int)*puVar40)) {
                        puVar40 = (ulong *)((long)puVar40 + 4);
                        puVar44 = (ulong *)((long)puVar44 + 4);
                      }
                      if ((puVar40 < puVar3) && ((short)*puVar44 == (short)*puVar40)) {
                        puVar40 = (ulong *)((long)puVar40 + 2);
                        puVar44 = (ulong *)((long)puVar44 + 2);
                      }
                      if (puVar40 < iEnd) {
                        puVar40 = (ulong *)((long)puVar40 +
                                           (ulong)((BYTE)*puVar44 == (BYTE)*puVar40));
                      }
                      pBVar38 = (BYTE *)((long)puVar40 - (long)puVar41);
                    }
                    unaff_RBP = pBVar38 + 8;
                    local_130 = (BYTE *)(ulong)(uint)((int)puVar55 - (int)plVar5);
                    iVar52 = 0x13;
                    if (local_118 < puVar55) {
                      piVar26 = (int *)(pBVar4 + uVar23);
                      while (puVar55 = puVar53, (BYTE)*puVar55 == (BYTE)*piVar26) {
                        unaff_RBP = unaff_RBP + 1;
                        if ((puVar55 <= local_118) ||
                           (bVar18 = piVar26 <= iStart, piVar26 = (int *)((long)piVar26 + -1),
                           puVar53 = (ulong *)((long)puVar55 + -1), bVar18)) goto LAB_01933d48;
                      }
                      puVar55 = (ulong *)((long)puVar55 + 1);
                    }
                  }
                  else {
LAB_01933b51:
                    local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                    puVar55 = puVar53;
                    iVar52 = 0;
                  }
                }
                else {
                  iVar52 = 0;
                  if ((char)uVar34 != (char)uVar58) goto LAB_01933b51;
                  uVar58 = uVar58 >> 8;
                  if (uVar9 < uVar58) {
                    if (*(long *)(pBVar12 + uVar58) == lVar36) {
                      sVar25 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar53 + 9),
                                          (BYTE *)((long)(pBVar12 + uVar58) + 8),(BYTE *)iEnd,
                                          (BYTE *)mEnd,(BYTE *)iStart);
                      unaff_RBP = (BYTE *)(sVar25 + 8);
                      local_130 = (BYTE *)(ulong)(UVar31 - (uVar45 + uVar58));
                      iVar52 = 0x13;
                      if (local_118 < puVar55) {
                        piVar26 = (int *)(pBVar12 + ((ulong)uVar58 - 1));
                        while (puVar55 = puVar53, (BYTE)*puVar55 == (BYTE)*piVar26) {
                          unaff_RBP = unaff_RBP + 1;
                          if ((puVar55 <= local_118) ||
                             (bVar18 = piVar26 <= piVar39, puVar53 = (ulong *)((long)puVar55 + -1),
                             piVar26 = (int *)((long)piVar26 + -1), bVar18)) goto LAB_01933d48;
                        }
                        puVar55 = (ulong *)((long)puVar55 + 1);
                      }
                    }
                    else {
                      local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                      puVar55 = puVar53;
                    }
                  }
                  else {
                    local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                    puVar55 = puVar53;
                    iVar52 = 0;
                  }
                }
LAB_01933d48:
                if (iVar52 == 0x13) goto LAB_01933f52;
                if (iVar52 != 0) goto LAB_01934233;
                puVar53 = (ulong *)((long)puVar55 + 4);
                puVar41 = (ulong *)(piVar35 + 1);
                if (uVar33 < uVar19) {
                  sVar25 = ZSTD_count_2segments
                                     ((BYTE *)puVar53,(BYTE *)puVar41,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  unaff_RBP = (BYTE *)(sVar25 + 4);
                  local_130 = (BYTE *)(ulong)(UVar54 - uVar33);
                  if ((piVar39 < piVar35) && (local_118 < puVar55)) {
                    puVar55 = (ulong *)((long)puVar55 + -1);
                    do {
                      piVar35 = (int *)((long)piVar35 + -1);
                      if ((BYTE)*puVar55 != *(BYTE *)piVar35) {
                        puVar55 = (ulong *)((long)puVar55 + 1);
                        goto LAB_01933f52;
                      }
                      unaff_RBP = unaff_RBP + 1;
                      puVar53 = (ulong *)((long)puVar55 + -1);
                    } while ((local_118 < puVar55) && (puVar55 = puVar53, piVar39 < piVar35));
LAB_01933ac8:
                    puVar55 = (ulong *)((long)puVar53 + 1);
                  }
                }
                else {
                  puVar40 = puVar53;
                  if (puVar53 < puVar1) {
                    uVar43 = *puVar53 ^ *puVar41;
                    uVar34 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar53) {
                      puVar40 = (ulong *)((long)puVar55 + 0xc);
                      puVar41 = (ulong *)(piVar35 + 3);
                      do {
                        if (puVar1 <= puVar40) goto LAB_01933e95;
                        uVar34 = *puVar41;
                        uVar43 = *puVar40;
                        uVar51 = uVar43 ^ uVar34;
                        uVar48 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)((long)puVar40 +
                                          ((uVar48 >> 3 & 0x1fffffff) - (long)puVar53));
                        puVar40 = puVar40 + 1;
                        puVar41 = puVar41 + 1;
                      } while (uVar34 == uVar43);
                    }
                  }
                  else {
LAB_01933e95:
                    if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar40 < iEnd) {
                      puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40))
                      ;
                    }
                    pBVar38 = (BYTE *)((long)puVar40 - (long)puVar53);
                  }
                  unaff_RBP = pBVar38 + 4;
                  local_130 = (BYTE *)(ulong)(uint)((int)puVar55 - (int)piVar35);
                  if ((iStart < piVar35) && (local_118 < puVar55)) {
                    puVar55 = (ulong *)((long)puVar55 + -1);
                    do {
                      piVar35 = (int *)((long)piVar35 + -1);
                      if ((BYTE)*puVar55 != *(BYTE *)piVar35) {
                        puVar55 = (ulong *)((long)puVar55 + 1);
                        goto LAB_01933f52;
                      }
                      unaff_RBP = unaff_RBP + 1;
                      puVar53 = (ulong *)((long)puVar55 + -1);
                    } while ((local_118 < puVar55) && (puVar55 = puVar53, iStart < piVar35));
                    goto LAB_01933ac8;
                  }
                }
LAB_01933f52:
                uVar34 = (long)puVar55 - (long)local_118;
                puVar53 = (ulong *)seqStore->lit;
                if (puVar24 < puVar55) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar53,(BYTE *)local_118,(BYTE *)puVar55,(BYTE *)puVar24);
                }
                else {
                  uVar43 = local_118[1];
                  *puVar53 = *local_118;
                  puVar53[1] = uVar43;
                  if (0x10 < uVar34) {
                    pBVar38 = seqStore->lit;
                    uVar43 = local_118[3];
                    *(ulong *)(pBVar38 + 0x10) = local_118[2];
                    *(ulong *)(pBVar38 + 0x18) = uVar43;
                    if (0x20 < (long)uVar34) {
                      lVar36 = 0;
                      do {
                        puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x20);
                        uVar20 = puVar8[1];
                        pBVar6 = pBVar38 + lVar36 + 0x20;
                        *(undefined8 *)pBVar6 = *puVar8;
                        *(undefined8 *)(pBVar6 + 8) = uVar20;
                        puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x30);
                        uVar20 = puVar8[1];
                        *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                        *(undefined8 *)(pBVar6 + 0x18) = uVar20;
                        lVar36 = lVar36 + 0x20;
                      } while (pBVar6 + 0x20 < pBVar38 + uVar34);
                    }
                  }
                }
                seqStore->lit = seqStore->lit + uVar34;
                if (0xffff < uVar34) {
                  seqStore->longLengthType = ZSTD_llt_literalLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
                psVar17 = seqStore->sequences;
                psVar17->litLength = (U16)uVar34;
                psVar17->offBase = (U32)local_130 + 3;
                pBVar38 = unaff_RBP + -3;
                UVar31 = (U32)local_130;
                UVar59 = local_154;
                goto joined_r0x01934012;
              }
            }
            else if ((char)uVar56 == (char)uVar58) {
              uVar33 = uVar58 >> 8;
              piVar35 = (int *)(pBVar12 + uVar33);
              if ((uVar33 <= uVar9) || (iVar52 = 0x16, *piVar35 != (int)*puVar53)) {
                iVar52 = 0;
              }
              if (iVar52 == 0x16) {
                uVar33 = uVar33 + uVar45;
                goto LAB_0193375b;
              }
              puVar55 = puVar53;
              if (iVar52 != 0) goto LAB_01934233;
            }
            puVar55 = (ulong *)((long)puVar53 + ((long)puVar53 - (long)local_118 >> 8) + 1);
          }
          else {
            if ((char)uVar43 != (char)uVar23) goto LAB_01933742;
            uVar23 = uVar23 >> 8;
            iVar52 = 0;
            if ((uVar9 < uVar23) && (*(ulong *)(pBVar12 + uVar23) == uVar34)) {
              sVar25 = ZSTD_count_2segments
                                 ((BYTE *)(puVar53 + 1),(BYTE *)((long)(pBVar12 + uVar23) + 8),
                                  (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
              unaff_RBP = (BYTE *)(sVar25 + 8);
              local_130 = (BYTE *)(ulong)(UVar54 - (uVar23 + uVar45));
              iVar52 = 0x13;
              if (local_118 < puVar53) {
                piVar35 = (int *)(pBVar12 + ((ulong)uVar23 - 1));
                do {
                  puVar55 = (ulong *)((long)puVar53 + -1);
                  if ((*(BYTE *)puVar55 != (BYTE)*piVar35) ||
                     (unaff_RBP = unaff_RBP + 1, puVar53 = puVar55, puVar55 <= local_118)) break;
                  bVar18 = piVar39 < piVar35;
                  piVar35 = (int *)((long)piVar35 + -1);
                } while (bVar18);
              }
            }
            puVar55 = puVar53;
            if (iVar52 == 0x13) goto LAB_01933f52;
            if (iVar52 == 0) goto LAB_01933742;
          }
        }
        else {
          puVar55 = (ulong *)((long)puVar53 + 1);
          puVar41 = iEnd;
          if (uVar32 < uVar19) {
            puVar41 = mEnd;
          }
          sVar25 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar53 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar41,(BYTE *)iStart);
          uVar34 = (long)puVar55 - (long)local_118;
          puVar53 = (ulong *)seqStore->lit;
          if (puVar24 < puVar55) {
            ZSTD_safecopyLiterals((BYTE *)puVar53,(BYTE *)local_118,(BYTE *)puVar55,(BYTE *)puVar24)
            ;
          }
          else {
            uVar43 = local_118[1];
            *puVar53 = *local_118;
            puVar53[1] = uVar43;
            if (0x10 < uVar34) {
              pBVar38 = seqStore->lit;
              uVar43 = local_118[3];
              *(ulong *)(pBVar38 + 0x10) = local_118[2];
              *(ulong *)(pBVar38 + 0x18) = uVar43;
              if (0x20 < (long)uVar34) {
                lVar36 = 0;
                do {
                  puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x20);
                  uVar20 = puVar8[1];
                  pBVar6 = pBVar38 + lVar36 + 0x20;
                  *(undefined8 *)pBVar6 = *puVar8;
                  *(undefined8 *)(pBVar6 + 8) = uVar20;
                  puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x30);
                  uVar20 = puVar8[1];
                  *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                  *(undefined8 *)(pBVar6 + 0x18) = uVar20;
                  lVar36 = lVar36 + 0x20;
                } while (pBVar6 + 0x20 < pBVar38 + uVar34);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_RBP = (BYTE *)(sVar25 + 4);
          psVar17 = seqStore->sequences;
          psVar17->litLength = (U16)uVar34;
          psVar17->offBase = 1;
          pBVar38 = (BYTE *)(sVar25 + 1);
          UVar31 = local_154;
joined_r0x01934012:
          local_154 = UVar31;
          if ((BYTE *)0xffff < pBVar38) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar17->mlBase = (U16)pBVar38;
          seqStore->sequences = psVar17 + 1;
          puVar55 = (ulong *)((long)puVar55 + (long)unaff_RBP);
          local_118 = puVar55;
          if (puVar55 <= puVar7) {
            uVar23 = UVar54 + 2;
            lVar36 = *(long *)(pBVar10 + uVar23);
            pUVar15[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] = uVar23;
            pUVar15[(ulong)(*(long *)((long)puVar55 + -2) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)]
                 = ((int)puVar55 + -2) - iVar49;
            pUVar16[(ulong)(lVar36 * -0x30e4432345000000) >> (bVar30 & 0x3f)] = uVar23;
            pUVar16[(ulong)(*(long *)((long)puVar55 + -1) * -0x30e4432345000000) >> (bVar30 & 0x3f)]
                 = ((int)puVar55 + -1) - iVar49;
            do {
              local_118 = puVar55;
              if (puVar7 < puVar55) break;
              UVar31 = (int)puVar55 - iVar49;
              uVar23 = UVar31 - UVar59;
              pBVar38 = pBVar10;
              if (uVar23 < uVar19) {
                pBVar38 = pBVar12 + -uVar47;
              }
              if (((uVar19 - 1) - uVar23 < 3) || (*(int *)(pBVar38 + uVar23) != (int)*puVar55)) {
                bVar18 = false;
                UVar31 = UVar59;
              }
              else {
                puVar53 = iEnd;
                if (uVar23 < uVar19) {
                  puVar53 = mEnd;
                }
                sVar25 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar55 + 4),
                                    (BYTE *)((long)(pBVar38 + uVar23) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar53,(BYTE *)iStart);
                puVar53 = (ulong *)seqStore->lit;
                if (puVar24 < puVar55) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar53,(BYTE *)puVar55,(BYTE *)puVar55,(BYTE *)puVar24);
                }
                else {
                  uVar34 = puVar55[1];
                  *puVar53 = *puVar55;
                  puVar53[1] = uVar34;
                }
                psVar17 = seqStore->sequences;
                psVar17->litLength = 0;
                psVar17->offBase = 1;
                if (0xffff < sVar25 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar17->mlBase = (U16)(sVar25 + 1);
                seqStore->sequences = psVar17 + 1;
                uVar34 = *puVar55;
                pUVar16[uVar34 * -0x30e4432345000000 >> (bVar30 & 0x3f)] = UVar31;
                pUVar15[uVar34 * -0x30e44323485a9b9d >> (bVar29 & 0x3f)] = UVar31;
                puVar55 = (ulong *)((long)puVar55 + sVar25 + 4);
                bVar18 = true;
                UVar31 = local_154;
                local_154 = UVar59;
              }
              UVar59 = UVar31;
              local_118 = puVar55;
            } while (bVar18);
          }
        }
LAB_01934233:
        puVar53 = puVar55;
      } while (puVar55 < puVar7);
    }
  }
  else if (uVar42 == 6) {
    if (iVar52 != 0) {
      if (uVar23 < 0x3e) {
        uVar34 = 0;
        do {
          uVar34 = uVar34 + 0x40;
        } while (uVar34 < (ulong)(4L << (bVar27 & 0x3f)));
      }
      if (uVar58 < 0x3e) {
        uVar34 = 0;
        do {
          uVar34 = uVar34 + 0x40;
        } while (uVar34 < (ulong)(4L << (bVar28 & 0x3f)));
      }
    }
    puVar53 = (ulong *)((long)src + (ulong)(iVar50 == 0));
    if (puVar53 < puVar7) {
      bVar29 = 0x40 - cVar21;
      bVar30 = 0x40 - cVar22;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar3 = (ulong *)((long)iEnd + -1);
      puVar24 = iEnd + -4;
      pBVar4 = pBVar10 + -1;
      local_130 = pBVar4;
      do {
        uVar34 = *puVar53;
        uVar48 = uVar34 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
        uVar51 = uVar34 * -0x30e4432340650000 >> (bVar30 & 0x3f);
        uVar43 = uVar34 * -0x30e44323485a9b9d >> (0x38 - bVar27 & 0x3f);
        uVar56 = uVar34 * -0x30e4432340650000 >> (0x38 - bVar28 & 0x3f);
        uVar23 = pUVar13[uVar43 >> 8];
        uVar58 = pUVar14[uVar56 >> 8];
        UVar54 = (int)puVar53 - iVar49;
        uVar42 = pUVar15[uVar48];
        UVar31 = UVar54 + 1;
        uVar32 = UVar31 - local_154;
        piVar35 = (int *)(pBVar10 + uVar32);
        if (uVar32 < uVar19) {
          piVar35 = (int *)(pBVar12 + (uVar32 - uVar45));
        }
        uVar33 = pUVar16[uVar51];
        pUVar16[uVar51] = UVar54;
        pUVar15[uVar48] = UVar54;
        if (((uVar19 - 1) - uVar32 < 3) || (*piVar35 != *(int *)((long)puVar53 + 1))) {
          if (uVar19 < uVar42) {
            puVar55 = (ulong *)(pBVar10 + uVar42);
            if (*puVar55 == uVar34) {
              puVar41 = puVar53 + 1;
              puVar44 = puVar55 + 1;
              puVar40 = puVar41;
              if (puVar41 < puVar1) {
                uVar43 = *puVar41 ^ *puVar44;
                uVar34 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                if (*puVar44 == *puVar41) {
                  puVar40 = puVar53 + 2;
                  puVar44 = puVar55 + 2;
                  do {
                    if (puVar1 <= puVar40) goto LAB_01932bad;
                    uVar34 = *puVar44;
                    uVar43 = *puVar40;
                    uVar51 = uVar43 ^ uVar34;
                    uVar48 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)((long)puVar40 + ((uVar48 >> 3 & 0x1fffffff) - (long)puVar41))
                    ;
                    puVar40 = puVar40 + 1;
                    puVar44 = puVar44 + 1;
                  } while (uVar34 == uVar43);
                }
              }
              else {
LAB_01932bad:
                if ((puVar40 < puVar2) && ((int)*puVar44 == (int)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar40 < puVar3) && ((short)*puVar44 == (short)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar40 < iEnd) {
                  puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar40));
                }
                pBVar38 = (BYTE *)((long)puVar40 - (long)puVar41);
              }
              unaff_RBP = pBVar38 + 8;
              local_130 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)puVar55);
              puVar55 = puVar53;
              if (local_118 < puVar53) {
                piVar35 = (int *)(pBVar4 + uVar42);
                puVar55 = (ulong *)((long)puVar53 + -1);
                do {
                  if ((BYTE)*puVar55 != (BYTE)*piVar35) {
                    puVar55 = (ulong *)((long)puVar55 + 1);
                    goto LAB_019330d4;
                  }
                  unaff_RBP = unaff_RBP + 1;
                  puVar53 = (ulong *)((long)puVar55 + -1);
                } while ((local_118 < puVar55) &&
                        (bVar18 = iStart < piVar35, piVar35 = (int *)((long)piVar35 + -1),
                        puVar55 = puVar53, bVar18));
                goto LAB_01932c4a;
              }
              goto LAB_019330d4;
            }
LAB_019328c4:
            if (uVar19 < uVar33) {
              piVar35 = (int *)(pBVar10 + uVar33);
              if (*piVar35 == (int)*puVar53) {
LAB_019328dd:
                lVar36 = *(long *)((long)puVar53 + 1);
                uVar43 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f);
                uVar34 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x38 - bVar27 & 0x3f);
                puVar55 = (ulong *)((long)puVar53 + 1);
                uVar23 = pUVar15[uVar43];
                uVar58 = pUVar13[uVar34 >> 8];
                pUVar15[uVar43] = UVar31;
                if (uVar19 < uVar23) {
                  plVar5 = (long *)(pBVar10 + uVar23);
                  if (*plVar5 == lVar36) {
                    puVar41 = (ulong *)((long)puVar53 + 9);
                    puVar44 = (ulong *)(plVar5 + 1);
                    puVar40 = puVar41;
                    if (puVar41 < puVar1) {
                      uVar43 = *puVar41 ^ *puVar44;
                      uVar34 = 0;
                      if (uVar43 != 0) {
                        for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                      if (*puVar44 == *puVar41) {
                        puVar40 = (ulong *)((long)puVar53 + 0x11);
                        puVar44 = (ulong *)(plVar5 + 2);
                        do {
                          if (puVar1 <= puVar40) goto LAB_01932db8;
                          uVar34 = *puVar44;
                          uVar43 = *puVar40;
                          uVar51 = uVar43 ^ uVar34;
                          uVar48 = 0;
                          if (uVar51 != 0) {
                            for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                            }
                          }
                          pBVar38 = (BYTE *)((long)puVar40 +
                                            ((uVar48 >> 3 & 0x1fffffff) - (long)puVar41));
                          puVar40 = puVar40 + 1;
                          puVar44 = puVar44 + 1;
                        } while (uVar34 == uVar43);
                      }
                    }
                    else {
LAB_01932db8:
                      if ((puVar40 < puVar2) && ((int)*puVar44 == (int)*puVar40)) {
                        puVar40 = (ulong *)((long)puVar40 + 4);
                        puVar44 = (ulong *)((long)puVar44 + 4);
                      }
                      if ((puVar40 < puVar3) && ((short)*puVar44 == (short)*puVar40)) {
                        puVar40 = (ulong *)((long)puVar40 + 2);
                        puVar44 = (ulong *)((long)puVar44 + 2);
                      }
                      if (puVar40 < iEnd) {
                        puVar40 = (ulong *)((long)puVar40 +
                                           (ulong)((BYTE)*puVar44 == (BYTE)*puVar40));
                      }
                      pBVar38 = (BYTE *)((long)puVar40 - (long)puVar41);
                    }
                    unaff_RBP = pBVar38 + 8;
                    local_130 = (BYTE *)(ulong)(uint)((int)puVar55 - (int)plVar5);
                    iVar52 = 0x13;
                    if (local_118 < puVar55) {
                      piVar26 = (int *)(pBVar4 + uVar23);
                      while (puVar55 = puVar53, (BYTE)*puVar55 == (BYTE)*piVar26) {
                        unaff_RBP = unaff_RBP + 1;
                        if ((puVar55 <= local_118) ||
                           (bVar18 = piVar26 <= iStart, piVar26 = (int *)((long)piVar26 + -1),
                           puVar53 = (ulong *)((long)puVar55 + -1), bVar18)) goto LAB_01932eca;
                      }
                      puVar55 = (ulong *)((long)puVar55 + 1);
                    }
                  }
                  else {
LAB_01932cd3:
                    local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                    puVar55 = puVar53;
                    iVar52 = 0;
                  }
                }
                else {
                  iVar52 = 0;
                  if ((char)uVar34 != (char)uVar58) goto LAB_01932cd3;
                  uVar58 = uVar58 >> 8;
                  if (uVar9 < uVar58) {
                    if (*(long *)(pBVar12 + uVar58) == lVar36) {
                      sVar25 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar53 + 9),
                                          (BYTE *)((long)(pBVar12 + uVar58) + 8),(BYTE *)iEnd,
                                          (BYTE *)mEnd,(BYTE *)iStart);
                      unaff_RBP = (BYTE *)(sVar25 + 8);
                      local_130 = (BYTE *)(ulong)(UVar31 - (uVar45 + uVar58));
                      iVar52 = 0x13;
                      if (local_118 < puVar55) {
                        piVar26 = (int *)(pBVar12 + ((ulong)uVar58 - 1));
                        while (puVar55 = puVar53, (BYTE)*puVar55 == (BYTE)*piVar26) {
                          unaff_RBP = unaff_RBP + 1;
                          if ((puVar55 <= local_118) ||
                             (bVar18 = piVar26 <= piVar39, puVar53 = (ulong *)((long)puVar55 + -1),
                             piVar26 = (int *)((long)piVar26 + -1), bVar18)) goto LAB_01932eca;
                        }
                        puVar55 = (ulong *)((long)puVar55 + 1);
                      }
                    }
                    else {
                      local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                      puVar55 = puVar53;
                    }
                  }
                  else {
                    local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                    puVar55 = puVar53;
                    iVar52 = 0;
                  }
                }
LAB_01932eca:
                if (iVar52 == 0x13) goto LAB_019330d4;
                if (iVar52 != 0) goto LAB_019333b5;
                puVar53 = (ulong *)((long)puVar55 + 4);
                puVar41 = (ulong *)(piVar35 + 1);
                if (uVar33 < uVar19) {
                  sVar25 = ZSTD_count_2segments
                                     ((BYTE *)puVar53,(BYTE *)puVar41,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  unaff_RBP = (BYTE *)(sVar25 + 4);
                  local_130 = (BYTE *)(ulong)(UVar54 - uVar33);
                  if ((piVar39 < piVar35) && (local_118 < puVar55)) {
                    puVar55 = (ulong *)((long)puVar55 + -1);
                    do {
                      piVar35 = (int *)((long)piVar35 + -1);
                      if ((BYTE)*puVar55 != *(BYTE *)piVar35) {
                        puVar55 = (ulong *)((long)puVar55 + 1);
                        goto LAB_019330d4;
                      }
                      unaff_RBP = unaff_RBP + 1;
                      puVar53 = (ulong *)((long)puVar55 + -1);
                    } while ((local_118 < puVar55) && (puVar55 = puVar53, piVar39 < piVar35));
LAB_01932c4a:
                    puVar55 = (ulong *)((long)puVar53 + 1);
                  }
                }
                else {
                  puVar40 = puVar53;
                  if (puVar53 < puVar1) {
                    uVar43 = *puVar53 ^ *puVar41;
                    uVar34 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar53) {
                      puVar40 = (ulong *)((long)puVar55 + 0xc);
                      puVar41 = (ulong *)(piVar35 + 3);
                      do {
                        if (puVar1 <= puVar40) goto LAB_01933017;
                        uVar34 = *puVar41;
                        uVar43 = *puVar40;
                        uVar51 = uVar43 ^ uVar34;
                        uVar48 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)((long)puVar40 +
                                          ((uVar48 >> 3 & 0x1fffffff) - (long)puVar53));
                        puVar40 = puVar40 + 1;
                        puVar41 = puVar41 + 1;
                      } while (uVar34 == uVar43);
                    }
                  }
                  else {
LAB_01933017:
                    if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar40 < iEnd) {
                      puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40))
                      ;
                    }
                    pBVar38 = (BYTE *)((long)puVar40 - (long)puVar53);
                  }
                  unaff_RBP = pBVar38 + 4;
                  local_130 = (BYTE *)(ulong)(uint)((int)puVar55 - (int)piVar35);
                  if ((iStart < piVar35) && (local_118 < puVar55)) {
                    puVar55 = (ulong *)((long)puVar55 + -1);
                    do {
                      piVar35 = (int *)((long)piVar35 + -1);
                      if ((BYTE)*puVar55 != *(BYTE *)piVar35) {
                        puVar55 = (ulong *)((long)puVar55 + 1);
                        goto LAB_019330d4;
                      }
                      unaff_RBP = unaff_RBP + 1;
                      puVar53 = (ulong *)((long)puVar55 + -1);
                    } while ((local_118 < puVar55) && (puVar55 = puVar53, iStart < piVar35));
                    goto LAB_01932c4a;
                  }
                }
LAB_019330d4:
                uVar34 = (long)puVar55 - (long)local_118;
                puVar53 = (ulong *)seqStore->lit;
                if (puVar24 < puVar55) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar53,(BYTE *)local_118,(BYTE *)puVar55,(BYTE *)puVar24);
                }
                else {
                  uVar43 = local_118[1];
                  *puVar53 = *local_118;
                  puVar53[1] = uVar43;
                  if (0x10 < uVar34) {
                    pBVar38 = seqStore->lit;
                    uVar43 = local_118[3];
                    *(ulong *)(pBVar38 + 0x10) = local_118[2];
                    *(ulong *)(pBVar38 + 0x18) = uVar43;
                    if (0x20 < (long)uVar34) {
                      lVar36 = 0;
                      do {
                        puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x20);
                        uVar20 = puVar8[1];
                        pBVar6 = pBVar38 + lVar36 + 0x20;
                        *(undefined8 *)pBVar6 = *puVar8;
                        *(undefined8 *)(pBVar6 + 8) = uVar20;
                        puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x30);
                        uVar20 = puVar8[1];
                        *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                        *(undefined8 *)(pBVar6 + 0x18) = uVar20;
                        lVar36 = lVar36 + 0x20;
                      } while (pBVar6 + 0x20 < pBVar38 + uVar34);
                    }
                  }
                }
                seqStore->lit = seqStore->lit + uVar34;
                if (0xffff < uVar34) {
                  seqStore->longLengthType = ZSTD_llt_literalLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
                psVar17 = seqStore->sequences;
                psVar17->litLength = (U16)uVar34;
                psVar17->offBase = (U32)local_130 + 3;
                pBVar38 = unaff_RBP + -3;
                UVar31 = (U32)local_130;
                UVar59 = local_154;
                goto joined_r0x01933194;
              }
            }
            else if ((char)uVar56 == (char)uVar58) {
              uVar33 = uVar58 >> 8;
              piVar35 = (int *)(pBVar12 + uVar33);
              if ((uVar33 <= uVar9) || (iVar52 = 0x16, *piVar35 != (int)*puVar53)) {
                iVar52 = 0;
              }
              if (iVar52 == 0x16) {
                uVar33 = uVar33 + uVar45;
                goto LAB_019328dd;
              }
              puVar55 = puVar53;
              if (iVar52 != 0) goto LAB_019333b5;
            }
            puVar55 = (ulong *)((long)puVar53 + ((long)puVar53 - (long)local_118 >> 8) + 1);
          }
          else {
            if ((char)uVar43 != (char)uVar23) goto LAB_019328c4;
            uVar23 = uVar23 >> 8;
            iVar52 = 0;
            if ((uVar9 < uVar23) && (*(ulong *)(pBVar12 + uVar23) == uVar34)) {
              sVar25 = ZSTD_count_2segments
                                 ((BYTE *)(puVar53 + 1),(BYTE *)((long)(pBVar12 + uVar23) + 8),
                                  (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
              unaff_RBP = (BYTE *)(sVar25 + 8);
              local_130 = (BYTE *)(ulong)(UVar54 - (uVar23 + uVar45));
              iVar52 = 0x13;
              if (local_118 < puVar53) {
                piVar35 = (int *)(pBVar12 + ((ulong)uVar23 - 1));
                do {
                  puVar55 = (ulong *)((long)puVar53 + -1);
                  if ((*(BYTE *)puVar55 != (BYTE)*piVar35) ||
                     (unaff_RBP = unaff_RBP + 1, puVar53 = puVar55, puVar55 <= local_118)) break;
                  bVar18 = piVar39 < piVar35;
                  piVar35 = (int *)((long)piVar35 + -1);
                } while (bVar18);
              }
            }
            puVar55 = puVar53;
            if (iVar52 == 0x13) goto LAB_019330d4;
            if (iVar52 == 0) goto LAB_019328c4;
          }
        }
        else {
          puVar55 = (ulong *)((long)puVar53 + 1);
          puVar41 = iEnd;
          if (uVar32 < uVar19) {
            puVar41 = mEnd;
          }
          sVar25 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar53 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar41,(BYTE *)iStart);
          uVar34 = (long)puVar55 - (long)local_118;
          puVar53 = (ulong *)seqStore->lit;
          if (puVar24 < puVar55) {
            ZSTD_safecopyLiterals((BYTE *)puVar53,(BYTE *)local_118,(BYTE *)puVar55,(BYTE *)puVar24)
            ;
          }
          else {
            uVar43 = local_118[1];
            *puVar53 = *local_118;
            puVar53[1] = uVar43;
            if (0x10 < uVar34) {
              pBVar38 = seqStore->lit;
              uVar43 = local_118[3];
              *(ulong *)(pBVar38 + 0x10) = local_118[2];
              *(ulong *)(pBVar38 + 0x18) = uVar43;
              if (0x20 < (long)uVar34) {
                lVar36 = 0;
                do {
                  puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x20);
                  uVar20 = puVar8[1];
                  pBVar6 = pBVar38 + lVar36 + 0x20;
                  *(undefined8 *)pBVar6 = *puVar8;
                  *(undefined8 *)(pBVar6 + 8) = uVar20;
                  puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x30);
                  uVar20 = puVar8[1];
                  *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                  *(undefined8 *)(pBVar6 + 0x18) = uVar20;
                  lVar36 = lVar36 + 0x20;
                } while (pBVar6 + 0x20 < pBVar38 + uVar34);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_RBP = (BYTE *)(sVar25 + 4);
          psVar17 = seqStore->sequences;
          psVar17->litLength = (U16)uVar34;
          psVar17->offBase = 1;
          pBVar38 = (BYTE *)(sVar25 + 1);
          UVar31 = local_154;
joined_r0x01933194:
          local_154 = UVar31;
          if ((BYTE *)0xffff < pBVar38) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar17->mlBase = (U16)pBVar38;
          seqStore->sequences = psVar17 + 1;
          puVar55 = (ulong *)((long)puVar55 + (long)unaff_RBP);
          local_118 = puVar55;
          if (puVar55 <= puVar7) {
            uVar23 = UVar54 + 2;
            lVar36 = *(long *)(pBVar10 + uVar23);
            pUVar15[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] = uVar23;
            pUVar15[(ulong)(*(long *)((long)puVar55 + -2) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)]
                 = ((int)puVar55 + -2) - iVar49;
            pUVar16[(ulong)(lVar36 * -0x30e4432340650000) >> (bVar30 & 0x3f)] = uVar23;
            pUVar16[(ulong)(*(long *)((long)puVar55 + -1) * -0x30e4432340650000) >> (bVar30 & 0x3f)]
                 = ((int)puVar55 + -1) - iVar49;
            do {
              local_118 = puVar55;
              if (puVar7 < puVar55) break;
              UVar31 = (int)puVar55 - iVar49;
              uVar23 = UVar31 - UVar59;
              pBVar38 = pBVar10;
              if (uVar23 < uVar19) {
                pBVar38 = pBVar12 + -uVar47;
              }
              if (((uVar19 - 1) - uVar23 < 3) || (*(int *)(pBVar38 + uVar23) != (int)*puVar55)) {
                bVar18 = false;
                UVar31 = UVar59;
              }
              else {
                puVar53 = iEnd;
                if (uVar23 < uVar19) {
                  puVar53 = mEnd;
                }
                sVar25 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar55 + 4),
                                    (BYTE *)((long)(pBVar38 + uVar23) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar53,(BYTE *)iStart);
                puVar53 = (ulong *)seqStore->lit;
                if (puVar24 < puVar55) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar53,(BYTE *)puVar55,(BYTE *)puVar55,(BYTE *)puVar24);
                }
                else {
                  uVar34 = puVar55[1];
                  *puVar53 = *puVar55;
                  puVar53[1] = uVar34;
                }
                psVar17 = seqStore->sequences;
                psVar17->litLength = 0;
                psVar17->offBase = 1;
                if (0xffff < sVar25 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar17->mlBase = (U16)(sVar25 + 1);
                seqStore->sequences = psVar17 + 1;
                uVar34 = *puVar55;
                pUVar16[uVar34 * -0x30e4432340650000 >> (bVar30 & 0x3f)] = UVar31;
                pUVar15[uVar34 * -0x30e44323485a9b9d >> (bVar29 & 0x3f)] = UVar31;
                puVar55 = (ulong *)((long)puVar55 + sVar25 + 4);
                bVar18 = true;
                UVar31 = local_154;
                local_154 = UVar59;
              }
              UVar59 = UVar31;
              local_118 = puVar55;
            } while (bVar18);
          }
        }
LAB_019333b5:
        puVar53 = puVar55;
      } while (puVar55 < puVar7);
    }
  }
  else if (uVar42 == 7) {
    if (iVar52 != 0) {
      if (uVar23 < 0x3e) {
        uVar34 = 0;
        do {
          uVar34 = uVar34 + 0x40;
        } while (uVar34 < (ulong)(4L << (bVar27 & 0x3f)));
      }
      if (uVar58 < 0x3e) {
        uVar34 = 0;
        do {
          uVar34 = uVar34 + 0x40;
        } while (uVar34 < (ulong)(4L << (bVar28 & 0x3f)));
      }
    }
    puVar53 = (ulong *)((long)src + (ulong)(iVar50 == 0));
    if (puVar53 < puVar7) {
      bVar29 = 0x40 - cVar21;
      bVar30 = 0x40 - cVar22;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar24 = iEnd + -4;
      pBVar4 = pBVar10 + -1;
      local_130 = pBVar4;
      do {
        uVar34 = *puVar53;
        uVar48 = uVar34 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
        uVar51 = uVar34 * -0x30e44323405a9d00 >> (bVar30 & 0x3f);
        uVar43 = uVar34 * -0x30e44323485a9b9d >> (0x38 - bVar27 & 0x3f);
        uVar56 = uVar34 * -0x30e44323405a9d00 >> (0x38 - bVar28 & 0x3f);
        uVar23 = pUVar13[uVar43 >> 8];
        uVar58 = pUVar14[uVar56 >> 8];
        UVar54 = (int)puVar53 - iVar49;
        uVar42 = pUVar15[uVar48];
        UVar31 = UVar54 + 1;
        uVar32 = UVar31 - local_154;
        piVar35 = (int *)(pBVar10 + uVar32);
        if (uVar32 < uVar19) {
          piVar35 = (int *)(pBVar12 + (uVar32 - uVar45));
        }
        uVar33 = pUVar16[uVar51];
        pUVar16[uVar51] = UVar54;
        pUVar15[uVar48] = UVar54;
        if (((uVar19 - 1) - uVar32 < 3) || (*piVar35 != *(int *)((long)puVar53 + 1))) {
          if (uVar19 < uVar42) {
            puVar55 = (ulong *)(pBVar10 + uVar42);
            if (*puVar55 == uVar34) {
              puVar41 = puVar53 + 1;
              puVar44 = puVar55 + 1;
              puVar40 = puVar41;
              if (puVar41 < puVar1) {
                uVar43 = *puVar41 ^ *puVar44;
                uVar34 = 0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                if (*puVar44 == *puVar41) {
                  puVar40 = puVar53 + 2;
                  puVar44 = puVar55 + 2;
                  do {
                    if (puVar1 <= puVar40) goto LAB_01931d2f;
                    uVar34 = *puVar44;
                    uVar43 = *puVar40;
                    uVar51 = uVar43 ^ uVar34;
                    uVar48 = 0;
                    if (uVar51 != 0) {
                      for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)((long)puVar40 + ((uVar48 >> 3 & 0x1fffffff) - (long)puVar41))
                    ;
                    puVar40 = puVar40 + 1;
                    puVar44 = puVar44 + 1;
                  } while (uVar34 == uVar43);
                }
              }
              else {
LAB_01931d2f:
                if ((puVar40 < puVar2) && ((int)*puVar44 == (int)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 4);
                  puVar44 = (ulong *)((long)puVar44 + 4);
                }
                if ((puVar40 < puVar3) && ((short)*puVar44 == (short)*puVar40)) {
                  puVar40 = (ulong *)((long)puVar40 + 2);
                  puVar44 = (ulong *)((long)puVar44 + 2);
                }
                if (puVar40 < iEnd) {
                  puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar44 == (BYTE)*puVar40));
                }
                pBVar38 = (BYTE *)((long)puVar40 - (long)puVar41);
              }
              unaff_RBP = pBVar38 + 8;
              local_130 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)puVar55);
              puVar55 = puVar53;
              if (local_118 < puVar53) {
                piVar35 = (int *)(pBVar4 + uVar42);
                puVar55 = (ulong *)((long)puVar53 + -1);
                do {
                  if ((BYTE)*puVar55 != (BYTE)*piVar35) {
                    puVar55 = (ulong *)((long)puVar55 + 1);
                    goto LAB_01932256;
                  }
                  unaff_RBP = unaff_RBP + 1;
                  puVar53 = (ulong *)((long)puVar55 + -1);
                } while ((local_118 < puVar55) &&
                        (bVar18 = iStart < piVar35, piVar35 = (int *)((long)piVar35 + -1),
                        puVar55 = puVar53, bVar18));
                goto LAB_01931dcc;
              }
              goto LAB_01932256;
            }
LAB_01931a46:
            if (uVar19 < uVar33) {
              piVar35 = (int *)(pBVar10 + uVar33);
              if (*piVar35 == (int)*puVar53) {
LAB_01931a5f:
                lVar36 = *(long *)((long)puVar53 + 1);
                uVar43 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f);
                uVar34 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x38 - bVar27 & 0x3f);
                puVar55 = (ulong *)((long)puVar53 + 1);
                uVar23 = pUVar15[uVar43];
                uVar58 = pUVar13[uVar34 >> 8];
                pUVar15[uVar43] = UVar31;
                if (uVar19 < uVar23) {
                  plVar5 = (long *)(pBVar10 + uVar23);
                  if (*plVar5 == lVar36) {
                    puVar41 = (ulong *)((long)puVar53 + 9);
                    puVar44 = (ulong *)(plVar5 + 1);
                    puVar40 = puVar41;
                    if (puVar41 < puVar1) {
                      uVar43 = *puVar41 ^ *puVar44;
                      uVar34 = 0;
                      if (uVar43 != 0) {
                        for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                      if (*puVar44 == *puVar41) {
                        puVar40 = (ulong *)((long)puVar53 + 0x11);
                        puVar44 = (ulong *)(plVar5 + 2);
                        do {
                          if (puVar1 <= puVar40) goto LAB_01931f3a;
                          uVar34 = *puVar44;
                          uVar43 = *puVar40;
                          uVar51 = uVar43 ^ uVar34;
                          uVar48 = 0;
                          if (uVar51 != 0) {
                            for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                            }
                          }
                          pBVar38 = (BYTE *)((long)puVar40 +
                                            ((uVar48 >> 3 & 0x1fffffff) - (long)puVar41));
                          puVar40 = puVar40 + 1;
                          puVar44 = puVar44 + 1;
                        } while (uVar34 == uVar43);
                      }
                    }
                    else {
LAB_01931f3a:
                      if ((puVar40 < puVar2) && ((int)*puVar44 == (int)*puVar40)) {
                        puVar40 = (ulong *)((long)puVar40 + 4);
                        puVar44 = (ulong *)((long)puVar44 + 4);
                      }
                      if ((puVar40 < puVar3) && ((short)*puVar44 == (short)*puVar40)) {
                        puVar40 = (ulong *)((long)puVar40 + 2);
                        puVar44 = (ulong *)((long)puVar44 + 2);
                      }
                      if (puVar40 < iEnd) {
                        puVar40 = (ulong *)((long)puVar40 +
                                           (ulong)((BYTE)*puVar44 == (BYTE)*puVar40));
                      }
                      pBVar38 = (BYTE *)((long)puVar40 - (long)puVar41);
                    }
                    unaff_RBP = pBVar38 + 8;
                    local_130 = (BYTE *)(ulong)(uint)((int)puVar55 - (int)plVar5);
                    iVar52 = 0x13;
                    if (local_118 < puVar55) {
                      piVar26 = (int *)(pBVar4 + uVar23);
                      while (puVar55 = puVar53, (BYTE)*puVar55 == (BYTE)*piVar26) {
                        unaff_RBP = unaff_RBP + 1;
                        if ((puVar55 <= local_118) ||
                           (bVar18 = piVar26 <= iStart, piVar26 = (int *)((long)piVar26 + -1),
                           puVar53 = (ulong *)((long)puVar55 + -1), bVar18)) goto LAB_0193204c;
                      }
                      puVar55 = (ulong *)((long)puVar55 + 1);
                    }
                  }
                  else {
LAB_01931e55:
                    local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                    puVar55 = puVar53;
                    iVar52 = 0;
                  }
                }
                else {
                  iVar52 = 0;
                  if ((char)uVar34 != (char)uVar58) goto LAB_01931e55;
                  uVar58 = uVar58 >> 8;
                  if (uVar9 < uVar58) {
                    if (*(long *)(pBVar12 + uVar58) == lVar36) {
                      sVar25 = ZSTD_count_2segments
                                         ((BYTE *)((long)puVar53 + 9),
                                          (BYTE *)((long)(pBVar12 + uVar58) + 8),(BYTE *)iEnd,
                                          (BYTE *)mEnd,(BYTE *)iStart);
                      unaff_RBP = (BYTE *)(sVar25 + 8);
                      local_130 = (BYTE *)(ulong)(UVar31 - (uVar45 + uVar58));
                      iVar52 = 0x13;
                      if (local_118 < puVar55) {
                        piVar26 = (int *)(pBVar12 + ((ulong)uVar58 - 1));
                        while (puVar55 = puVar53, (BYTE)*puVar55 == (BYTE)*piVar26) {
                          unaff_RBP = unaff_RBP + 1;
                          if ((puVar55 <= local_118) ||
                             (bVar18 = piVar26 <= piVar39, puVar53 = (ulong *)((long)puVar55 + -1),
                             piVar26 = (int *)((long)piVar26 + -1), bVar18)) goto LAB_0193204c;
                        }
                        puVar55 = (ulong *)((long)puVar55 + 1);
                      }
                    }
                    else {
                      local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                      puVar55 = puVar53;
                    }
                  }
                  else {
                    local_130 = (BYTE *)((ulong)local_130 & 0xffffffff);
                    puVar55 = puVar53;
                    iVar52 = 0;
                  }
                }
LAB_0193204c:
                if (iVar52 == 0x13) goto LAB_01932256;
                if (iVar52 != 0) goto LAB_01932537;
                puVar53 = (ulong *)((long)puVar55 + 4);
                puVar41 = (ulong *)(piVar35 + 1);
                if (uVar33 < uVar19) {
                  sVar25 = ZSTD_count_2segments
                                     ((BYTE *)puVar53,(BYTE *)puVar41,(BYTE *)iEnd,(BYTE *)mEnd,
                                      (BYTE *)iStart);
                  unaff_RBP = (BYTE *)(sVar25 + 4);
                  local_130 = (BYTE *)(ulong)(UVar54 - uVar33);
                  if ((piVar39 < piVar35) && (local_118 < puVar55)) {
                    puVar55 = (ulong *)((long)puVar55 + -1);
                    do {
                      piVar35 = (int *)((long)piVar35 + -1);
                      if ((BYTE)*puVar55 != *(BYTE *)piVar35) {
                        puVar55 = (ulong *)((long)puVar55 + 1);
                        goto LAB_01932256;
                      }
                      unaff_RBP = unaff_RBP + 1;
                      puVar53 = (ulong *)((long)puVar55 + -1);
                    } while ((local_118 < puVar55) && (puVar55 = puVar53, piVar39 < piVar35));
LAB_01931dcc:
                    puVar55 = (ulong *)((long)puVar53 + 1);
                  }
                }
                else {
                  puVar40 = puVar53;
                  if (puVar53 < puVar1) {
                    uVar43 = *puVar53 ^ *puVar41;
                    uVar34 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar53) {
                      puVar40 = (ulong *)((long)puVar55 + 0xc);
                      puVar41 = (ulong *)(piVar35 + 3);
                      do {
                        if (puVar1 <= puVar40) goto LAB_01932199;
                        uVar34 = *puVar41;
                        uVar43 = *puVar40;
                        uVar51 = uVar43 ^ uVar34;
                        uVar48 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)((long)puVar40 +
                                          ((uVar48 >> 3 & 0x1fffffff) - (long)puVar53));
                        puVar40 = puVar40 + 1;
                        puVar41 = puVar41 + 1;
                      } while (uVar34 == uVar43);
                    }
                  }
                  else {
LAB_01932199:
                    if ((puVar40 < puVar2) && ((int)*puVar41 == (int)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar40 < puVar3) && ((short)*puVar41 == (short)*puVar40)) {
                      puVar40 = (ulong *)((long)puVar40 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar40 < iEnd) {
                      puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar40))
                      ;
                    }
                    pBVar38 = (BYTE *)((long)puVar40 - (long)puVar53);
                  }
                  unaff_RBP = pBVar38 + 4;
                  local_130 = (BYTE *)(ulong)(uint)((int)puVar55 - (int)piVar35);
                  if ((iStart < piVar35) && (local_118 < puVar55)) {
                    puVar55 = (ulong *)((long)puVar55 + -1);
                    do {
                      piVar35 = (int *)((long)piVar35 + -1);
                      if ((BYTE)*puVar55 != *(BYTE *)piVar35) {
                        puVar55 = (ulong *)((long)puVar55 + 1);
                        goto LAB_01932256;
                      }
                      unaff_RBP = unaff_RBP + 1;
                      puVar53 = (ulong *)((long)puVar55 + -1);
                    } while ((local_118 < puVar55) && (puVar55 = puVar53, iStart < piVar35));
                    goto LAB_01931dcc;
                  }
                }
LAB_01932256:
                uVar34 = (long)puVar55 - (long)local_118;
                puVar53 = (ulong *)seqStore->lit;
                if (puVar24 < puVar55) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar53,(BYTE *)local_118,(BYTE *)puVar55,(BYTE *)puVar24);
                }
                else {
                  uVar43 = local_118[1];
                  *puVar53 = *local_118;
                  puVar53[1] = uVar43;
                  if (0x10 < uVar34) {
                    pBVar38 = seqStore->lit;
                    uVar43 = local_118[3];
                    *(ulong *)(pBVar38 + 0x10) = local_118[2];
                    *(ulong *)(pBVar38 + 0x18) = uVar43;
                    if (0x20 < (long)uVar34) {
                      lVar36 = 0;
                      do {
                        puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x20);
                        uVar20 = puVar8[1];
                        pBVar6 = pBVar38 + lVar36 + 0x20;
                        *(undefined8 *)pBVar6 = *puVar8;
                        *(undefined8 *)(pBVar6 + 8) = uVar20;
                        puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x30);
                        uVar20 = puVar8[1];
                        *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                        *(undefined8 *)(pBVar6 + 0x18) = uVar20;
                        lVar36 = lVar36 + 0x20;
                      } while (pBVar6 + 0x20 < pBVar38 + uVar34);
                    }
                  }
                }
                seqStore->lit = seqStore->lit + uVar34;
                if (0xffff < uVar34) {
                  seqStore->longLengthType = ZSTD_llt_literalLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
                psVar17 = seqStore->sequences;
                psVar17->litLength = (U16)uVar34;
                psVar17->offBase = (U32)local_130 + 3;
                pBVar38 = unaff_RBP + -3;
                UVar31 = (U32)local_130;
                UVar59 = local_154;
                goto joined_r0x01932316;
              }
            }
            else if ((char)uVar56 == (char)uVar58) {
              uVar33 = uVar58 >> 8;
              piVar35 = (int *)(pBVar12 + uVar33);
              if ((uVar33 <= uVar9) || (iVar52 = 0x16, *piVar35 != (int)*puVar53)) {
                iVar52 = 0;
              }
              if (iVar52 == 0x16) {
                uVar33 = uVar33 + uVar45;
                goto LAB_01931a5f;
              }
              puVar55 = puVar53;
              if (iVar52 != 0) goto LAB_01932537;
            }
            puVar55 = (ulong *)((long)puVar53 + ((long)puVar53 - (long)local_118 >> 8) + 1);
          }
          else {
            if ((char)uVar43 != (char)uVar23) goto LAB_01931a46;
            uVar23 = uVar23 >> 8;
            iVar52 = 0;
            if ((uVar9 < uVar23) && (*(ulong *)(pBVar12 + uVar23) == uVar34)) {
              sVar25 = ZSTD_count_2segments
                                 ((BYTE *)(puVar53 + 1),(BYTE *)((long)(pBVar12 + uVar23) + 8),
                                  (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
              unaff_RBP = (BYTE *)(sVar25 + 8);
              local_130 = (BYTE *)(ulong)(UVar54 - (uVar23 + uVar45));
              iVar52 = 0x13;
              if (local_118 < puVar53) {
                piVar35 = (int *)(pBVar12 + ((ulong)uVar23 - 1));
                do {
                  puVar55 = (ulong *)((long)puVar53 + -1);
                  if ((*(BYTE *)puVar55 != (BYTE)*piVar35) ||
                     (unaff_RBP = unaff_RBP + 1, puVar53 = puVar55, puVar55 <= local_118)) break;
                  bVar18 = piVar39 < piVar35;
                  piVar35 = (int *)((long)piVar35 + -1);
                } while (bVar18);
              }
            }
            puVar55 = puVar53;
            if (iVar52 == 0x13) goto LAB_01932256;
            if (iVar52 == 0) goto LAB_01931a46;
          }
        }
        else {
          puVar55 = (ulong *)((long)puVar53 + 1);
          puVar41 = iEnd;
          if (uVar32 < uVar19) {
            puVar41 = mEnd;
          }
          sVar25 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar53 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar41,(BYTE *)iStart);
          uVar34 = (long)puVar55 - (long)local_118;
          puVar53 = (ulong *)seqStore->lit;
          if (puVar24 < puVar55) {
            ZSTD_safecopyLiterals((BYTE *)puVar53,(BYTE *)local_118,(BYTE *)puVar55,(BYTE *)puVar24)
            ;
          }
          else {
            uVar43 = local_118[1];
            *puVar53 = *local_118;
            puVar53[1] = uVar43;
            if (0x10 < uVar34) {
              pBVar38 = seqStore->lit;
              uVar43 = local_118[3];
              *(ulong *)(pBVar38 + 0x10) = local_118[2];
              *(ulong *)(pBVar38 + 0x18) = uVar43;
              if (0x20 < (long)uVar34) {
                lVar36 = 0;
                do {
                  puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x20);
                  uVar20 = puVar8[1];
                  pBVar6 = pBVar38 + lVar36 + 0x20;
                  *(undefined8 *)pBVar6 = *puVar8;
                  *(undefined8 *)(pBVar6 + 8) = uVar20;
                  puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x30);
                  uVar20 = puVar8[1];
                  *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                  *(undefined8 *)(pBVar6 + 0x18) = uVar20;
                  lVar36 = lVar36 + 0x20;
                } while (pBVar6 + 0x20 < pBVar38 + uVar34);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar34;
          if (0xffff < uVar34) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_RBP = (BYTE *)(sVar25 + 4);
          psVar17 = seqStore->sequences;
          psVar17->litLength = (U16)uVar34;
          psVar17->offBase = 1;
          pBVar38 = (BYTE *)(sVar25 + 1);
          UVar31 = local_154;
joined_r0x01932316:
          local_154 = UVar31;
          if ((BYTE *)0xffff < pBVar38) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar17->mlBase = (U16)pBVar38;
          seqStore->sequences = psVar17 + 1;
          puVar55 = (ulong *)((long)puVar55 + (long)unaff_RBP);
          local_118 = puVar55;
          if (puVar55 <= puVar7) {
            uVar23 = UVar54 + 2;
            lVar36 = *(long *)(pBVar10 + uVar23);
            pUVar15[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] = uVar23;
            pUVar15[(ulong)(*(long *)((long)puVar55 + -2) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)]
                 = ((int)puVar55 + -2) - iVar49;
            pUVar16[(ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar30 & 0x3f)] = uVar23;
            pUVar16[(ulong)(*(long *)((long)puVar55 + -1) * -0x30e44323405a9d00) >> (bVar30 & 0x3f)]
                 = ((int)puVar55 + -1) - iVar49;
            do {
              local_118 = puVar55;
              if (puVar7 < puVar55) break;
              UVar31 = (int)puVar55 - iVar49;
              uVar23 = UVar31 - UVar59;
              pBVar38 = pBVar10;
              if (uVar23 < uVar19) {
                pBVar38 = pBVar12 + -uVar47;
              }
              if (((uVar19 - 1) - uVar23 < 3) || (*(int *)(pBVar38 + uVar23) != (int)*puVar55)) {
                bVar18 = false;
                UVar31 = UVar59;
              }
              else {
                puVar53 = iEnd;
                if (uVar23 < uVar19) {
                  puVar53 = mEnd;
                }
                sVar25 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar55 + 4),
                                    (BYTE *)((long)(pBVar38 + uVar23) + 4),(BYTE *)iEnd,
                                    (BYTE *)puVar53,(BYTE *)iStart);
                puVar53 = (ulong *)seqStore->lit;
                if (puVar24 < puVar55) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar53,(BYTE *)puVar55,(BYTE *)puVar55,(BYTE *)puVar24);
                }
                else {
                  uVar34 = puVar55[1];
                  *puVar53 = *puVar55;
                  puVar53[1] = uVar34;
                }
                psVar17 = seqStore->sequences;
                psVar17->litLength = 0;
                psVar17->offBase = 1;
                if (0xffff < sVar25 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar17->mlBase = (U16)(sVar25 + 1);
                seqStore->sequences = psVar17 + 1;
                uVar34 = *puVar55;
                pUVar16[uVar34 * -0x30e44323405a9d00 >> (bVar30 & 0x3f)] = UVar31;
                pUVar15[uVar34 * -0x30e44323485a9b9d >> (bVar29 & 0x3f)] = UVar31;
                puVar55 = (ulong *)((long)puVar55 + sVar25 + 4);
                bVar18 = true;
                UVar31 = local_154;
                local_154 = UVar59;
              }
              UVar59 = UVar31;
              local_118 = puVar55;
            } while (bVar18);
          }
        }
LAB_01932537:
        puVar53 = puVar55;
      } while (puVar55 < puVar7);
    }
  }
  else {
    if (iVar52 != 0) {
      if (uVar23 < 0x3e) {
        uVar34 = 0;
        do {
          uVar34 = uVar34 + 0x40;
        } while (uVar34 < (ulong)(4L << (bVar27 & 0x3f)));
      }
      if (uVar58 < 0x3e) {
        uVar34 = 0;
        do {
          uVar34 = uVar34 + 0x40;
        } while (uVar34 < (ulong)(4L << (bVar28 & 0x3f)));
      }
    }
    puVar53 = (ulong *)((long)src + (ulong)(iVar50 == 0));
    if (puVar53 < puVar7) {
      bVar29 = 0x40 - cVar21;
      bVar30 = 0x20 - cVar22;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar3 = (ulong *)((long)iEnd + -1);
      puVar24 = iEnd + -4;
      pBVar4 = pBVar10 + -1;
      pUVar57 = pUVar13;
      local_f8 = pBVar4;
LAB_0193435f:
      uVar43 = *puVar53 * -0x30e44323485a9b9d >> (bVar29 & 0x3f);
      uVar33 = (int)*puVar53 * -0x61c8864f;
      uVar46 = uVar33 >> (bVar30 & 0x1f);
      uVar34 = *puVar53 * -0x30e44323485a9b9d >> (0x38 - bVar27 & 0x3f);
      uVar33 = uVar33 >> (0x18 - bVar28 & 0x1f);
      uVar23 = pUVar13[uVar34 >> 8];
      uVar58 = pUVar14[uVar33 >> 8];
      UVar54 = (int)puVar53 - iVar49;
      uVar42 = pUVar15[uVar43];
      UVar31 = UVar54 + 1;
      uVar32 = UVar31 - local_154;
      piVar35 = (int *)(pBVar10 + uVar32);
      if (uVar32 < uVar19) {
        piVar35 = (int *)(pBVar12 + (uVar32 - uVar45));
      }
      uVar37 = pUVar16[uVar46];
      pUVar16[uVar46] = UVar54;
      pUVar15[uVar43] = UVar54;
      if ((2 < (uVar19 - 1) - uVar32) && (*piVar35 == *(int *)((long)puVar53 + 1))) {
        puVar55 = (ulong *)((long)puVar53 + 1);
        puVar41 = iEnd;
        if (uVar32 < uVar19) {
          puVar41 = mEnd;
        }
        sVar25 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar53 + 5),(BYTE *)(piVar35 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar41,(BYTE *)iStart);
        uVar34 = (long)puVar55 - (long)local_118;
        puVar53 = (ulong *)seqStore->lit;
        if (puVar24 < puVar55) {
          ZSTD_safecopyLiterals((BYTE *)puVar53,(BYTE *)local_118,(BYTE *)puVar55,(BYTE *)puVar24);
        }
        else {
          uVar43 = local_118[1];
          *puVar53 = *local_118;
          puVar53[1] = uVar43;
          if (0x10 < uVar34) {
            pBVar38 = seqStore->lit;
            uVar43 = local_118[3];
            *(ulong *)(pBVar38 + 0x10) = local_118[2];
            *(ulong *)(pBVar38 + 0x18) = uVar43;
            if (0x20 < (long)uVar34) {
              lVar36 = 0;
              do {
                puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x20);
                uVar20 = puVar8[1];
                pBVar6 = pBVar38 + lVar36 + 0x20;
                *(undefined8 *)pBVar6 = *puVar8;
                *(undefined8 *)(pBVar6 + 8) = uVar20;
                puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x30);
                uVar20 = puVar8[1];
                *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
                *(undefined8 *)(pBVar6 + 0x18) = uVar20;
                lVar36 = lVar36 + 0x20;
              } while (pBVar6 + 0x20 < pBVar38 + uVar34);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar34;
        if (0xffff < uVar34) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        pUVar57 = (U32 *)(sVar25 + 4);
        psVar17 = seqStore->sequences;
        psVar17->litLength = (U16)uVar34;
        psVar17->offBase = 1;
        pBVar38 = (BYTE *)(sVar25 + 1);
        puVar53 = puVar55;
        goto joined_r0x0193480d;
      }
      puVar55 = puVar53;
      if (uVar19 < uVar42) {
        puVar41 = (ulong *)(pBVar10 + uVar42);
        if (*puVar41 != *puVar53) goto LAB_0193455d;
        puVar40 = puVar53 + 1;
        puVar55 = puVar41 + 1;
        puVar44 = puVar40;
        if (puVar40 < puVar1) {
          uVar43 = *puVar40 ^ *puVar55;
          uVar34 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
            }
          }
          pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
          if (*puVar55 == *puVar40) {
            puVar44 = puVar53 + 2;
            puVar55 = puVar41 + 2;
            do {
              if (puVar1 <= puVar44) goto LAB_0193481b;
              uVar34 = *puVar55;
              uVar43 = *puVar44;
              uVar51 = uVar43 ^ uVar34;
              uVar48 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                }
              }
              pBVar38 = (BYTE *)((long)puVar44 + ((uVar48 >> 3 & 0x1fffffff) - (long)puVar40));
              puVar44 = puVar44 + 1;
              puVar55 = puVar55 + 1;
            } while (uVar34 == uVar43);
          }
        }
        else {
LAB_0193481b:
          if ((puVar44 < puVar2) && ((int)*puVar55 == (int)*puVar44)) {
            puVar44 = (ulong *)((long)puVar44 + 4);
            puVar55 = (ulong *)((long)puVar55 + 4);
          }
          if ((puVar44 < puVar3) && ((short)*puVar55 == (short)*puVar44)) {
            puVar44 = (ulong *)((long)puVar44 + 2);
            puVar55 = (ulong *)((long)puVar55 + 2);
          }
          if (puVar44 < iEnd) {
            puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar55 == (BYTE)*puVar44));
          }
          pBVar38 = (BYTE *)((long)puVar44 - (long)puVar40);
        }
        pUVar57 = (U32 *)(pBVar38 + 8);
        local_f8 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)puVar41);
        if (puVar53 <= local_118) goto LAB_01934c9b;
        piVar35 = (int *)(pBVar4 + uVar42);
        puVar55 = (ulong *)((long)puVar53 + -1);
        do {
          if ((BYTE)*puVar55 != (BYTE)*piVar35) goto LAB_01934c95;
          pUVar57 = (U32 *)((long)pUVar57 + 1);
          puVar53 = (ulong *)((long)puVar55 + -1);
        } while ((local_118 < puVar55) &&
                (bVar18 = iStart < piVar35, piVar35 = (int *)((long)piVar35 + -1), puVar55 = puVar53
                , bVar18));
        goto LAB_019348bb;
      }
      if ((char)uVar34 == (char)uVar23) {
        uVar23 = uVar23 >> 8;
        iVar52 = 0;
        if ((uVar9 < uVar23) && (*(ulong *)(pBVar12 + uVar23) == *puVar53)) {
          sVar25 = ZSTD_count_2segments
                             ((BYTE *)(puVar53 + 1),(BYTE *)((long)(pBVar12 + uVar23) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          pUVar57 = (U32 *)(sVar25 + 8);
          local_f8 = (BYTE *)(ulong)(UVar54 - (uVar23 + uVar45));
          iVar52 = 0x13;
          if (local_118 < puVar53) {
            piVar35 = (int *)(pBVar12 + ((ulong)uVar23 - 1));
            do {
              puVar55 = (ulong *)((long)puVar53 + -1);
              if ((*(BYTE *)puVar55 != (BYTE)*piVar35) ||
                 (pUVar57 = (U32 *)((long)pUVar57 + 1), puVar53 = puVar55, puVar55 <= local_118))
              break;
              bVar18 = piVar39 < piVar35;
              piVar35 = (int *)((long)piVar35 + -1);
            } while (bVar18);
          }
        }
        if (iVar52 != 0x13) {
          puVar55 = puVar53;
          if (iVar52 == 0) goto LAB_0193455d;
          goto LAB_01934f8b;
        }
        goto LAB_01934c9b;
      }
LAB_0193455d:
      if (uVar19 < uVar37) {
        piVar35 = (int *)(pBVar10 + uVar37);
        if (*piVar35 != (int)*puVar55) goto LAB_01934689;
LAB_01934578:
        lVar36 = *(long *)((long)puVar55 + 1);
        uVar43 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar29 & 0x3f);
        uVar34 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (0x38 - bVar27 & 0x3f);
        puVar53 = (ulong *)((long)puVar55 + 1);
        uVar23 = pUVar15[uVar43];
        uVar58 = pUVar13[uVar34 >> 8];
        pUVar15[uVar43] = UVar31;
        if (uVar19 < uVar23) {
          plVar5 = (long *)(pBVar10 + uVar23);
          if (*plVar5 != lVar36) goto LAB_019349c0;
          puVar40 = (ulong *)((long)puVar55 + 9);
          puVar41 = (ulong *)(plVar5 + 1);
          puVar44 = puVar40;
          if (puVar40 < puVar1) {
            uVar43 = *puVar40 ^ *puVar41;
            uVar34 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
            if (*puVar41 == *puVar40) {
              puVar44 = (ulong *)((long)puVar55 + 0x11);
              puVar41 = (ulong *)(plVar5 + 2);
              do {
                if (puVar1 <= puVar44) goto LAB_01934b10;
                uVar34 = *puVar41;
                uVar43 = *puVar44;
                uVar51 = uVar43 ^ uVar34;
                uVar48 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                  }
                }
                pBVar38 = (BYTE *)((long)puVar44 + ((uVar48 >> 3 & 0x1fffffff) - (long)puVar40));
                puVar44 = puVar44 + 1;
                puVar41 = puVar41 + 1;
              } while (uVar34 == uVar43);
            }
          }
          else {
LAB_01934b10:
            if ((puVar44 < puVar2) && ((int)*puVar41 == (int)*puVar44)) {
              puVar44 = (ulong *)((long)puVar44 + 4);
              puVar41 = (ulong *)((long)puVar41 + 4);
            }
            if ((puVar44 < puVar3) && ((short)*puVar41 == (short)*puVar44)) {
              puVar44 = (ulong *)((long)puVar44 + 2);
              puVar41 = (ulong *)((long)puVar41 + 2);
            }
            if (puVar44 < iEnd) {
              puVar44 = (ulong *)((long)puVar44 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar44));
            }
            pBVar38 = (BYTE *)((long)puVar44 - (long)puVar40);
          }
          pUVar57 = (U32 *)(pBVar38 + 8);
          uVar42 = (int)puVar53 - (int)plVar5;
          iVar52 = 0x13;
          if (local_118 < puVar53) {
            piVar26 = (int *)(pBVar4 + uVar23);
            do {
              puVar53 = puVar55;
              if ((BYTE)*puVar53 != (BYTE)*piVar26) goto LAB_01934f98;
              pUVar57 = (U32 *)((long)pUVar57 + 1);
            } while ((local_118 < puVar53) &&
                    (bVar18 = iStart < piVar26, piVar26 = (int *)((long)piVar26 + -1),
                    puVar55 = (ulong *)((long)puVar53 + -1), bVar18));
          }
        }
        else {
          if ((char)uVar34 == (char)uVar58) {
            uVar58 = uVar58 >> 8;
            if ((uVar9 < uVar58) && (*(long *)(pBVar12 + uVar58) == lVar36)) {
              sVar25 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar55 + 9),(BYTE *)((long)(pBVar12 + uVar58) + 8)
                                  ,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
              pUVar57 = (U32 *)(sVar25 + 8);
              uVar42 = UVar31 - (uVar45 + uVar58);
              iVar52 = 0x13;
              if (local_118 < puVar53) {
                piVar26 = (int *)(pBVar12 + ((ulong)uVar58 - 1));
                do {
                  puVar53 = puVar55;
                  if ((BYTE)*puVar53 != (BYTE)*piVar26) goto LAB_01934f98;
                  pUVar57 = (U32 *)((long)pUVar57 + 1);
                } while ((local_118 < puVar53) &&
                        (bVar18 = piVar39 < piVar26, piVar26 = (int *)((long)piVar26 + -1),
                        puVar55 = (ulong *)((long)puVar53 + -1), bVar18));
              }
              goto LAB_019349c7;
            }
          }
LAB_019349c0:
          iVar52 = 0;
          uVar42 = (uint)local_f8;
          puVar53 = puVar55;
        }
        goto LAB_019349c7;
      }
      if ((char)uVar33 == (char)uVar58) {
        uVar58 = uVar58 >> 8;
        piVar35 = (int *)(pBVar12 + uVar58);
        if ((uVar58 <= uVar9) || (iVar52 = 0x16, *piVar35 != (int)*puVar55)) {
          iVar52 = 0;
        }
        if (iVar52 == 0x16) {
          uVar37 = uVar58 + uVar45;
          goto LAB_01934578;
        }
        if (iVar52 != 0) goto LAB_01934f8b;
      }
LAB_01934689:
      puVar55 = (ulong *)((long)puVar55 + ((long)puVar55 - (long)local_118 >> 8) + 1);
      goto LAB_01934f8b;
    }
  }
LAB_01934fb8:
  *rep = local_154;
  rep[1] = UVar59;
  return (long)iEnd - (long)local_118;
LAB_01934f98:
  iVar52 = 0x13;
  puVar53 = (ulong *)((long)puVar53 + 1);
LAB_019349c7:
  if (iVar52 == 0x13) {
    local_f8 = (BYTE *)(ulong)uVar42;
  }
  else {
    if (iVar52 != 0) {
      local_f8 = (BYTE *)(ulong)uVar42;
      puVar55 = puVar53;
      goto LAB_01934f8b;
    }
    puVar41 = (ulong *)((long)puVar53 + 4);
    puVar55 = (ulong *)(piVar35 + 1);
    if (uVar37 < uVar19) {
      sVar25 = ZSTD_count_2segments
                         ((BYTE *)puVar41,(BYTE *)puVar55,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      pUVar57 = (U32 *)(sVar25 + 4);
      local_f8 = (BYTE *)(ulong)(UVar54 - uVar37);
      if ((piVar39 < piVar35) && (local_118 < puVar53)) {
        puVar55 = (ulong *)((long)puVar53 + -1);
        do {
          piVar35 = (int *)((long)piVar35 + -1);
          if ((BYTE)*puVar55 != *(BYTE *)piVar35) goto LAB_01934c95;
          pUVar57 = (U32 *)((long)pUVar57 + 1);
          puVar53 = (ulong *)((long)puVar55 + -1);
        } while ((local_118 < puVar55) && (puVar55 = puVar53, piVar39 < piVar35));
LAB_019348bb:
        puVar53 = (ulong *)((long)puVar53 + 1);
      }
    }
    else {
      puVar40 = puVar41;
      if (puVar41 < puVar1) {
        uVar43 = *puVar41 ^ *puVar55;
        uVar34 = 0;
        if (uVar43 != 0) {
          for (; (uVar43 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
          }
        }
        pBVar38 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
        if (*puVar55 == *puVar41) {
          puVar40 = (ulong *)((long)puVar53 + 0xc);
          puVar55 = (ulong *)(piVar35 + 3);
          do {
            if (puVar1 <= puVar40) goto LAB_01934bf8;
            uVar34 = *puVar55;
            uVar43 = *puVar40;
            uVar51 = uVar43 ^ uVar34;
            uVar48 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
              }
            }
            pBVar38 = (BYTE *)((long)puVar40 + ((uVar48 >> 3 & 0x1fffffff) - (long)puVar41));
            puVar40 = puVar40 + 1;
            puVar55 = puVar55 + 1;
          } while (uVar34 == uVar43);
        }
      }
      else {
LAB_01934bf8:
        if ((puVar40 < puVar2) && ((int)*puVar55 == (int)*puVar40)) {
          puVar40 = (ulong *)((long)puVar40 + 4);
          puVar55 = (ulong *)((long)puVar55 + 4);
        }
        if ((puVar40 < puVar3) && ((short)*puVar55 == (short)*puVar40)) {
          puVar40 = (ulong *)((long)puVar40 + 2);
          puVar55 = (ulong *)((long)puVar55 + 2);
        }
        if (puVar40 < iEnd) {
          puVar40 = (ulong *)((long)puVar40 + (ulong)((BYTE)*puVar55 == (BYTE)*puVar40));
        }
        pBVar38 = (BYTE *)((long)puVar40 - (long)puVar41);
      }
      pUVar57 = (U32 *)(pBVar38 + 4);
      local_f8 = (BYTE *)(ulong)(uint)((int)puVar53 - (int)piVar35);
      if ((iStart < piVar35) && (local_118 < puVar53)) {
        puVar55 = (ulong *)((long)puVar53 + -1);
        do {
          piVar35 = (int *)((long)piVar35 + -1);
          if ((BYTE)*puVar55 != *(BYTE *)piVar35) goto LAB_01934c95;
          pUVar57 = (U32 *)((long)pUVar57 + 1);
          puVar53 = (ulong *)((long)puVar55 + -1);
        } while ((local_118 < puVar55) && (puVar55 = puVar53, iStart < piVar35));
        goto LAB_019348bb;
      }
    }
  }
LAB_01934c9b:
  uVar34 = (long)puVar53 - (long)local_118;
  puVar55 = (ulong *)seqStore->lit;
  if (puVar24 < puVar53) {
    ZSTD_safecopyLiterals((BYTE *)puVar55,(BYTE *)local_118,(BYTE *)puVar53,(BYTE *)puVar24);
  }
  else {
    uVar43 = local_118[1];
    *puVar55 = *local_118;
    puVar55[1] = uVar43;
    if (0x10 < uVar34) {
      pBVar38 = seqStore->lit;
      uVar43 = local_118[3];
      *(ulong *)(pBVar38 + 0x10) = local_118[2];
      *(ulong *)(pBVar38 + 0x18) = uVar43;
      if (0x20 < (long)uVar34) {
        lVar36 = 0;
        do {
          puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x20);
          uVar20 = puVar8[1];
          pBVar6 = pBVar38 + lVar36 + 0x20;
          *(undefined8 *)pBVar6 = *puVar8;
          *(undefined8 *)(pBVar6 + 8) = uVar20;
          puVar8 = (undefined8 *)((long)local_118 + lVar36 + 0x30);
          uVar20 = puVar8[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar8;
          *(undefined8 *)(pBVar6 + 0x18) = uVar20;
          lVar36 = lVar36 + 0x20;
        } while (pBVar6 + 0x20 < pBVar38 + uVar34);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar34;
  if (0xffff < uVar34) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar17 = seqStore->sequences;
  psVar17->litLength = (U16)uVar34;
  psVar17->offBase = (U32)local_f8 + 3;
  pBVar38 = (BYTE *)((long)pUVar57 + -3);
  UVar59 = local_154;
  local_154 = (U32)local_f8;
joined_r0x0193480d:
  if ((BYTE *)0xffff < pBVar38) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar17->mlBase = (U16)pBVar38;
  seqStore->sequences = psVar17 + 1;
  puVar55 = (ulong *)((long)puVar53 + (long)pUVar57);
  local_118 = puVar55;
  if (puVar55 <= puVar7) {
    uVar23 = UVar54 + 2;
    pUVar15[(ulong)(*(long *)(pBVar10 + uVar23) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] = uVar23;
    pUVar15[(ulong)(*(long *)((long)puVar55 + -2) * -0x30e44323485a9b9d) >> (bVar29 & 0x3f)] =
         ((int)puVar55 + -2) - iVar49;
    pUVar16[(uint)(*(int *)(pBVar10 + uVar23) * -0x61c8864f) >> (bVar30 & 0x1f)] = uVar23;
    pUVar16[(uint)(*(int *)((long)puVar55 + -1) * -0x61c8864f) >> (bVar30 & 0x1f)] =
         ((int)puVar55 + -1) - iVar49;
    do {
      local_118 = puVar55;
      if (puVar7 < puVar55) break;
      UVar31 = (int)puVar55 - iVar49;
      uVar23 = UVar31 - UVar59;
      pBVar38 = pBVar10;
      if (uVar23 < uVar19) {
        pBVar38 = pBVar12 + -uVar47;
      }
      if (((uVar19 - 1) - uVar23 < 3) || (*(int *)(pBVar38 + uVar23) != (int)*puVar55)) {
        bVar18 = false;
        UVar31 = UVar59;
      }
      else {
        puVar53 = iEnd;
        if (uVar23 < uVar19) {
          puVar53 = mEnd;
        }
        sVar25 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar55 + 4),(BYTE *)((long)(pBVar38 + uVar23) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar53,(BYTE *)iStart);
        puVar53 = (ulong *)seqStore->lit;
        if (puVar24 < puVar55) {
          ZSTD_safecopyLiterals((BYTE *)puVar53,(BYTE *)puVar55,(BYTE *)puVar55,(BYTE *)puVar24);
        }
        else {
          uVar34 = puVar55[1];
          *puVar53 = *puVar55;
          puVar53[1] = uVar34;
        }
        psVar17 = seqStore->sequences;
        psVar17->litLength = 0;
        psVar17->offBase = 1;
        if (0xffff < sVar25 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar17->mlBase = (U16)(sVar25 + 1);
        seqStore->sequences = psVar17 + 1;
        pUVar16[(uint)((int)*puVar55 * -0x61c8864f) >> (bVar30 & 0x1f)] = UVar31;
        pUVar15[*puVar55 * -0x30e44323485a9b9d >> (bVar29 & 0x3f)] = UVar31;
        puVar55 = (ulong *)((long)puVar55 + sVar25 + 4);
        bVar18 = true;
        UVar31 = local_154;
        local_154 = UVar59;
      }
      UVar59 = UVar31;
      local_118 = puVar55;
    } while (bVar18);
  }
LAB_01934f8b:
  puVar53 = puVar55;
  if (puVar7 <= puVar55) goto LAB_01934fb8;
  goto LAB_0193435f;
LAB_01934c95:
  puVar53 = (ulong *)((long)puVar55 + 1);
  goto LAB_01934c9b;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}